

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close.c
# Opt level: O2

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *puVar1;
  int iVar2;
  undefined8 uVar3;
  char *__format;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  char *pcVar8;
  uv_connect_t *puVar9;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_buf_t send_bufs [4096];
  
  puVar1 = connect_req.handle;
  if (req == &connect_req) {
    eval_b = (int64_t)status;
    send_bufs[0].base = (char *)eval_b;
    if ((uv_connect_t *)eval_b == (uv_connect_t *)0x0) {
      connect_cb_called = connect_cb_called + 1;
      for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
        for (lVar6 = 8; lVar6 != 0x10008; lVar6 = lVar6 + 0x10) {
          auVar7 = uv_buf_init(send_buffer + bytes_sent,0x2728);
          *(long *)((long)send_bufs + lVar6 + -8) = auVar7._0_8_;
          *(long *)((long)&send_bufs[0].base + lVar6) = auVar7._8_8_;
          bytes_sent = bytes_sent + 0x2728;
        }
        iVar2 = uv_write(write_reqs + lVar5,puVar1,send_bufs,0x1000,write_cb);
        eval_b = (int64_t)iVar2;
        eval_b_1 = 0;
        if (eval_b != 0) {
          uVar3 = 0x86;
          goto LAB_00193e30;
        }
      }
      iVar2 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
      eval_b = (int64_t)iVar2;
      eval_b_1 = 0;
      if (eval_b == 0) {
        iVar2 = uv_read_start(puVar1,alloc_cb,read_cb);
        eval_b = (int64_t)iVar2;
        if (eval_b == 0) {
          return;
        }
        uVar3 = 0x8f;
      }
      else {
        uVar3 = 0x8b;
      }
LAB_00193e30:
      eval_b_1 = 0;
      pcVar4 = "r";
    }
    else {
      pcVar4 = "status";
      uVar3 = 0x77;
    }
    puVar9 = (uv_connect_t *)0x0;
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar8 = "0";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar4 = "req";
    uVar3 = 0x76;
    puVar9 = &connect_req;
    pcVar8 = "&connect_req";
    eval_b = (int64_t)req;
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
          ,uVar3,pcVar4,"==",pcVar8,eval_b,"==",puVar9);
  abort();
}

Assistant:

static void connect_cb(uv_connect_t* conn_req, int status) {
  uv_write_t* req;
  uv_buf_t buf;
  int i, r;

  buf = uv_buf_init("PING", 4);
  for (i = 0; i < NUM_WRITE_REQS; i++) {
    req = malloc(sizeof *req);
    ASSERT_NOT_NULL(req);

    r = uv_write(req, (uv_stream_t*)&tcp_handle, &buf, 1, write_cb);
    ASSERT_OK(r);
  }

  uv_close((uv_handle_t*)&tcp_handle, close_cb);
}